

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::SendAndClose(TCPSocket *this,Ptr *buff,size_t len)

{
  Poller *this_00;
  bool bVar1;
  element_type *this_01;
  enable_shared_from_this<hwnet::TCPSocket> local_48;
  shared_ptr<hwnet::Task> local_38;
  byte local_21;
  void *pvStack_20;
  bool post;
  size_t len_local;
  Ptr *buff_local;
  TCPSocket *this_local;
  
  pvStack_20 = (void *)len;
  len_local = (size_t)buff;
  buff_local = (Ptr *)this;
  bVar1 = std::operator==(buff,(nullptr_t)0x0);
  if (!bVar1) {
    if (pvStack_20 == (void *)0x0) {
      this_01 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)len_local);
      pvStack_20 = (void *)Buffer::Len(this_01);
    }
    if (pvStack_20 != (void *)0x0) {
      local_21 = 0;
      std::mutex::lock(&this->mtx);
      _send(this,(int)len_local,pvStack_20,1,(int)&local_21);
      std::mutex::unlock(&this->mtx);
      if ((local_21 & 1) != 0) {
        this_00 = this->poller_;
        std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(&local_48);
        std::shared_ptr<hwnet::Task>::shared_ptr<hwnet::TCPSocket,void>
                  (&local_38,(shared_ptr<hwnet::TCPSocket> *)&local_48);
        Poller::PostTask(this_00,&local_38,this->pool_);
        std::shared_ptr<hwnet::Task>::~shared_ptr(&local_38);
        std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&local_48);
      }
    }
  }
  return;
}

Assistant:

void TCPSocket::SendAndClose(const Buffer::Ptr &buff,size_t len) {
	if(buff == nullptr) {
		return;
	}

	if(len == 0) {
		len = buff->Len();
	}

	if(len == 0) {
		return;
	}

	auto post = false;
	

	this->mtx.lock();
	_send(buff,len,true,post);
	this->mtx.unlock();		
	
	
	if(post) {
		poller_->PostTask(shared_from_this(),this->pool_);
	}
}